

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

char * CVmRun::get_exc_message(CVmException *exc,size_t *msg_len)

{
  int iVar1;
  char *pcVar2;
  CVmException *in_RDI;
  size_t *unaff_retaddr;
  vm_obj_id_t exc_obj;
  
  iVar1 = CVmException::get_error_code(in_RDI);
  if ((iVar1 == 0x8fe) && (iVar1 = CVmException::get_param_count(in_RDI), 0 < iVar1)) {
    CVmException::get_param_ulong(in_RDI,0);
    pcVar2 = get_exc_message(exc_obj,unaff_retaddr);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char *CVmRun::get_exc_message(VMG_ const CVmException *exc,
                                    size_t *msg_len)
{
    vm_obj_id_t exc_obj;

    /* 
     *   if the error isn't "unhandled exception," there's not a stored
     *   exception object; likewise, if there's no object parameter in the
     *   exception, there's nothing to use to obtain the message 
     */
    if (exc->get_error_code() != VMERR_UNHANDLED_EXC
        || exc->get_param_count() < 1)
        return 0;
    
    /* get the exception object */
    exc_obj = (vm_obj_id_t)exc->get_param_ulong(0);

    /* get the message from the object */
    return get_exc_message(vmg_ exc_obj, msg_len);
}